

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O0

bool __thiscall
llvm::ConvertUTF8toWide
          (llvm *this,uint WideCharWidth,StringRef Source,char **ResultPtr,UTF8 **ErrorPtr)

{
  Boolean BVar1;
  UTF8 *sourceEnd;
  undefined4 in_register_00000034;
  bool local_b5;
  UTF32 *pUStack_b0;
  ConversionFlags flags_1;
  UTF32 *targetStart_1;
  UTF8 *sourceStart_1;
  UTF16 *pUStack_98;
  ConversionFlags flags;
  UTF16 *targetStart;
  UTF8 *sourceStart;
  UTF8 *Pos;
  char **ppcStack_78;
  ConversionResult result;
  UTF8 **ErrorPtr_local;
  char **ResultPtr_local;
  undefined1 auStack_60 [4];
  uint WideCharWidth_local;
  StringRef Source_local;
  
  _auStack_60 = (UTF32 *)CONCAT44(in_register_00000034,WideCharWidth);
  ErrorPtr_local = (UTF8 **)Source.Length;
  Source_local.Data = Source.Data;
  ResultPtr_local._4_4_ = (int)this;
  local_b5 = true;
  if ((ResultPtr_local._4_4_ != 1) && (local_b5 = true, ResultPtr_local._4_4_ != 2)) {
    local_b5 = ResultPtr_local._4_4_ == 4;
  }
  ppcStack_78 = ResultPtr;
  if (!local_b5) {
    __assert_fail("WideCharWidth == 1 || WideCharWidth == 2 || WideCharWidth == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ConvertUTFWrapper.cpp"
                  ,0x16,
                  "bool llvm::ConvertUTF8toWide(unsigned int, llvm::StringRef, char *&, const UTF8 *&)"
                 );
  }
  Pos._4_4_ = conversionOK;
  if (ResultPtr_local._4_4_ == 1) {
    sourceStart = (UTF8 *)StringRef::begin((StringRef *)auStack_60);
    sourceEnd = (UTF8 *)StringRef::end((StringRef *)auStack_60);
    BVar1 = isLegalUTF8String(&sourceStart,sourceEnd);
    if (BVar1 == '\0') {
      Pos._4_4_ = sourceIllegal;
      *ppcStack_78 = (char *)sourceStart;
    }
    else {
      memcpy(*ErrorPtr_local,_auStack_60,(size_t)Source_local.Data);
      *ErrorPtr_local = (UTF8 *)(Source_local.Data + (long)*ErrorPtr_local);
    }
  }
  else if (ResultPtr_local._4_4_ == 2) {
    pUStack_98 = (UTF16 *)*ErrorPtr_local;
    sourceStart_1._4_4_ = 0;
    targetStart = (UTF16 *)_auStack_60;
    Pos._4_4_ = ConvertUTF8toUTF16((UTF8 **)&targetStart,
                                   (UTF8 *)((long)_auStack_60 + (long)Source_local.Data),
                                   &stack0xffffffffffffff68,pUStack_98 + (long)Source_local.Data,
                                   strictConversion);
    if (Pos._4_4_ == conversionOK) {
      *ErrorPtr_local = (UTF8 *)pUStack_98;
    }
    else {
      *ppcStack_78 = (char *)targetStart;
    }
  }
  else if (ResultPtr_local._4_4_ == 4) {
    Source_local.Length = (size_t)auStack_60;
    pUStack_b0 = (UTF32 *)*ErrorPtr_local;
    targetStart_1 = _auStack_60;
    Pos._4_4_ = ConvertUTF8toUTF32((UTF8 **)&targetStart_1,
                                   (UTF8 *)((long)_auStack_60 + (long)Source_local.Data),
                                   &stack0xffffffffffffff50,pUStack_b0 + (long)Source_local.Data,
                                   strictConversion);
    if (Pos._4_4_ == conversionOK) {
      *ErrorPtr_local = (UTF8 *)pUStack_b0;
    }
    else {
      *ppcStack_78 = (char *)targetStart_1;
    }
  }
  if (Pos._4_4_ != targetExhausted) {
    return Pos._4_4_ == conversionOK;
  }
  __assert_fail("(result != targetExhausted) && \"ConvertUTF8toUTFXX exhausted target buffer\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ConvertUTFWrapper.cpp"
                ,0x3e,
                "bool llvm::ConvertUTF8toWide(unsigned int, llvm::StringRef, char *&, const UTF8 *&)"
               );
}

Assistant:

bool ConvertUTF8toWide(unsigned WideCharWidth, llvm::StringRef Source,
                       char *&ResultPtr, const UTF8 *&ErrorPtr) {
  assert(WideCharWidth == 1 || WideCharWidth == 2 || WideCharWidth == 4);
  ConversionResult result = conversionOK;
  // Copy the character span over.
  if (WideCharWidth == 1) {
    const UTF8 *Pos = reinterpret_cast<const UTF8*>(Source.begin());
    if (!isLegalUTF8String(&Pos, reinterpret_cast<const UTF8*>(Source.end()))) {
      result = sourceIllegal;
      ErrorPtr = Pos;
    } else {
      memcpy(ResultPtr, Source.data(), Source.size());
      ResultPtr += Source.size();
    }
  } else if (WideCharWidth == 2) {
    const UTF8 *sourceStart = (const UTF8*)Source.data();
    // FIXME: Make the type of the result buffer correct instead of
    // using reinterpret_cast.
    UTF16 *targetStart = reinterpret_cast<UTF16*>(ResultPtr);
    ConversionFlags flags = strictConversion;
    result = ConvertUTF8toUTF16(
        &sourceStart, sourceStart + Source.size(),
        &targetStart, targetStart + Source.size(), flags);
    if (result == conversionOK)
      ResultPtr = reinterpret_cast<char*>(targetStart);
    else
      ErrorPtr = sourceStart;
  } else if (WideCharWidth == 4) {
    const UTF8 *sourceStart = (const UTF8*)Source.data();
    // FIXME: Make the type of the result buffer correct instead of
    // using reinterpret_cast.
    UTF32 *targetStart = reinterpret_cast<UTF32*>(ResultPtr);
    ConversionFlags flags = strictConversion;
    result = ConvertUTF8toUTF32(
        &sourceStart, sourceStart + Source.size(),
        &targetStart, targetStart + Source.size(), flags);
    if (result == conversionOK)
      ResultPtr = reinterpret_cast<char*>(targetStart);
    else
      ErrorPtr = sourceStart;
  }
  assert((result != targetExhausted)
         && "ConvertUTF8toUTFXX exhausted target buffer");
  return result == conversionOK;
}